

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceArrayIntersectorK<8>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  NodeRef nodeRef;
  undefined1 (*pauVar16) [32];
  ulong uVar17;
  ulong uVar18;
  Primitive_conflict4 *prim;
  long lVar19;
  ulong *puVar20;
  bool bVar21;
  undefined1 auVar22 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar39 [64];
  Precalculations pre;
  vbool<8> valid_leaf;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5951;
  RayHitK<8> *local_5950;
  RayQueryContext *local_5948;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5940;
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  uint uStack_5844;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  uint uStack_5824;
  undefined8 uStack_5810;
  ulong auStack_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar5 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
      auVar5 = vpcmpeqd_avx2(auVar5,(undefined1  [32])valid_i->field_0);
      if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar5 >> 0x7f,0) != '\0') ||
            (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar5 >> 0xbf,0) != '\0') ||
          (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar5[0x1f] < '\0')
      {
        auVar26._8_4_ = 0x7fffffff;
        auVar26._0_8_ = 0x7fffffff7fffffff;
        auVar26._12_4_ = 0x7fffffff;
        auVar26._16_4_ = 0x7fffffff;
        auVar26._20_4_ = 0x7fffffff;
        auVar26._24_4_ = 0x7fffffff;
        auVar26._28_4_ = 0x7fffffff;
        auVar27._8_4_ = 0x219392ef;
        auVar27._0_8_ = 0x219392ef219392ef;
        auVar27._12_4_ = 0x219392ef;
        auVar27._16_4_ = 0x219392ef;
        auVar27._20_4_ = 0x219392ef;
        auVar27._24_4_ = 0x219392ef;
        auVar27._28_4_ = 0x219392ef;
        auVar4 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar26);
        auVar4 = vcmpps_avx(auVar4,auVar27,1);
        auVar24 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar27,auVar4);
        auVar22 = vrcpps_avx(auVar24);
        auVar32._8_4_ = 0x3f800000;
        auVar32._0_8_ = &DAT_3f8000003f800000;
        auVar32._12_4_ = 0x3f800000;
        auVar32._16_4_ = 0x3f800000;
        auVar32._20_4_ = 0x3f800000;
        auVar32._24_4_ = 0x3f800000;
        auVar32._28_4_ = 0x3f800000;
        auVar4 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar26);
        auVar4 = vcmpps_avx(auVar4,auVar27,1);
        auVar25 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar27,auVar4);
        auVar9 = vfnmadd213ps_fma(auVar24,auVar22,auVar32);
        auVar24 = vrcpps_avx(auVar25);
        auVar4 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar26);
        auVar4 = vcmpps_avx(auVar4,auVar27,1);
        auVar4 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar27,auVar4);
        auVar10 = vfnmadd213ps_fma(auVar25,auVar24,auVar32);
        auVar25 = vrcpps_avx(auVar4);
        auVar11 = vfnmadd213ps_fma(auVar4,auVar25,auVar32);
        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar25,auVar25);
        auVar35 = ZEXT1664(auVar11);
        auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar24,auVar24);
        auVar33 = ZEXT1664(auVar10);
        auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar22,auVar22);
        auVar34 = ZEXT1664(auVar9);
        auVar4 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar36 = ZEXT3264(local_4680);
        local_4660 = vblendvps_avx(local_4680,auVar4,auVar5);
        auVar37 = ZEXT3264(local_4660);
        auVar24._8_4_ = 0xff800000;
        auVar24._0_8_ = 0xff800000ff800000;
        auVar24._12_4_ = 0xff800000;
        auVar24._16_4_ = 0xff800000;
        auVar24._20_4_ = 0xff800000;
        auVar24._24_4_ = 0xff800000;
        auVar24._28_4_ = 0xff800000;
        auVar4 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
        auVar5 = vblendvps_avx(auVar24,auVar4,auVar5);
        auVar38 = ZEXT3264(auVar5);
        puVar20 = auStack_5808 + 1;
        pauVar16 = (undefined1 (*) [32])local_4640;
        auVar39._0_4_ = auVar11._0_4_ * -*(float *)ray;
        auVar39._4_4_ = auVar11._4_4_ * -*(float *)(ray + 4);
        auVar39._8_4_ = auVar11._8_4_ * -*(float *)(ray + 8);
        auVar39._12_4_ = auVar11._12_4_ * -*(float *)(ray + 0xc);
        auVar39._16_4_ = -*(float *)(ray + 0x10) * 0.0;
        auVar39._20_4_ = -*(float *)(ray + 0x14) * 0.0;
        auVar39._28_36_ = in_ZMM15._28_36_;
        auVar39._24_4_ = -*(float *)(ray + 0x18) * 0.0;
        auVar39 = ZEXT3264(auVar39._0_32_);
        uStack_5824 = *(uint *)(ray + 0x3c) ^ 0x80000000;
        local_5840 = auVar10._0_4_ * -*(float *)(ray + 0x20);
        fStack_583c = auVar10._4_4_ * -*(float *)(ray + 0x24);
        fStack_5838 = auVar10._8_4_ * -*(float *)(ray + 0x28);
        fStack_5834 = auVar10._12_4_ * -*(float *)(ray + 0x2c);
        fStack_5830 = -*(float *)(ray + 0x30) * 0.0;
        fStack_582c = -*(float *)(ray + 0x34) * 0.0;
        fStack_5828 = -*(float *)(ray + 0x38) * 0.0;
        uStack_5844 = *(uint *)(ray + 0x5c) ^ 0x80000000;
        local_5860 = auVar9._0_4_ * -*(float *)(ray + 0x40);
        fStack_585c = auVar9._4_4_ * -*(float *)(ray + 0x44);
        fStack_5858 = auVar9._8_4_ * -*(float *)(ray + 0x48);
        fStack_5854 = auVar9._12_4_ * -*(float *)(ray + 0x4c);
        fStack_5850 = -*(float *)(ray + 0x50) * 0.0;
        fStack_584c = -*(float *)(ray + 0x54) * 0.0;
        fStack_5848 = -*(float *)(ray + 0x58) * 0.0;
        uStack_5810 = 0xfffffffffffffff8;
        auStack_5808[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
        local_5948 = context;
        local_5950 = ray;
        do {
          pauVar16 = pauVar16 + -1;
          puVar1 = puVar20 + -1;
          puVar20 = puVar20 + -1;
          bVar12 = true;
          if (*puVar1 != 0xfffffffffffffff8) {
            auVar23 = ZEXT3264(*pauVar16);
            local_5900 = auVar38._0_32_;
            auVar5 = vcmpps_avx(*pauVar16,local_5900,1);
            uVar17 = *puVar1;
            if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar5 >> 0x7f,0) != '\0') ||
                  (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar5 >> 0xbf,0) != '\0') ||
                (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar5[0x1f] < '\0') {
              do {
                local_58c0 = auVar35._0_32_;
                local_5920 = auVar39._0_32_;
                local_58a0 = auVar33._0_32_;
                local_5880 = auVar34._0_32_;
                local_58e0 = auVar37._0_32_;
                if ((uVar17 & 8) != 0) {
                  if (uVar17 == 0xfffffffffffffff8) goto LAB_006a01af;
                  local_5940 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                               vcmpps_avx(local_5900,auVar23._0_32_,6);
                  if (((((((((undefined1  [32])local_5940 >> 0x1f & (undefined1  [32])0x1) !=
                            (undefined1  [32])0x0 ||
                           ((undefined1  [32])local_5940 >> 0x3f & (undefined1  [32])0x1) !=
                           (undefined1  [32])0x0) ||
                          ((undefined1  [32])local_5940 >> 0x5f & (undefined1  [32])0x1) !=
                          (undefined1  [32])0x0) ||
                         SUB321((undefined1  [32])local_5940 >> 0x7f,0) != '\0') ||
                        ((undefined1  [32])local_5940 & (undefined1  [32])0x100000000) !=
                        (undefined1  [32])0x0) ||
                       SUB321((undefined1  [32])local_5940 >> 0xbf,0) != '\0') ||
                      ((undefined1  [32])local_5940 & (undefined1  [32])0x100000000) !=
                      (undefined1  [32])0x0) || local_5940.i[7]._3_1_ < '\0') {
                    lVar19 = (ulong)((uint)uVar17 & 0xf) - 8;
                    if (lVar19 != 0) {
                      prim = (Primitive_conflict4 *)(uVar17 & 0xfffffffffffffff0);
                      do {
                        InstanceArrayIntersectorK<8>::intersect
                                  ((vbool<8> *)&local_5940.field_1,&local_5951,local_5950,local_5948
                                   ,prim);
                        prim = prim + 1;
                        lVar19 = lVar19 + -1;
                      } while (lVar19 != 0);
                    }
                    auVar5 = vblendvps_avx(local_5900,*(undefined1 (*) [32])(local_5950 + 0x100),
                                           (undefined1  [32])local_5940);
                    auVar38 = ZEXT3264(auVar5);
                    auVar34 = ZEXT3264(local_5880);
                    auVar33 = ZEXT3264(local_58a0);
                    auVar35 = ZEXT3264(local_58c0);
                    auVar36 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar37 = ZEXT3264(local_58e0);
                    auVar39 = ZEXT3264(local_5920);
                  }
                  break;
                }
                uVar15 = 0;
                auVar23 = ZEXT3264(auVar36._0_32_);
                uVar13 = 0;
                uVar18 = 8;
                do {
                  uVar3 = *(ulong *)((uVar17 & 0xfffffffffffffff0) + uVar13 * 8);
                  if (uVar3 != 8) {
                    uVar2 = *(undefined4 *)(uVar17 + 0x40 + uVar13 * 4);
                    auVar25._4_4_ = uVar2;
                    auVar25._0_4_ = uVar2;
                    auVar25._8_4_ = uVar2;
                    auVar25._12_4_ = uVar2;
                    auVar25._16_4_ = uVar2;
                    auVar25._20_4_ = uVar2;
                    auVar25._24_4_ = uVar2;
                    auVar25._28_4_ = uVar2;
                    uVar2 = *(undefined4 *)(uVar17 + 0x80 + uVar13 * 4);
                    auVar22._4_4_ = uVar2;
                    auVar22._0_4_ = uVar2;
                    auVar22._8_4_ = uVar2;
                    auVar22._12_4_ = uVar2;
                    auVar22._16_4_ = uVar2;
                    auVar22._20_4_ = uVar2;
                    auVar22._24_4_ = uVar2;
                    auVar22._28_4_ = uVar2;
                    auVar11 = vfmadd213ps_fma(auVar25,local_58c0,local_5920);
                    auVar4._4_4_ = fStack_583c;
                    auVar4._0_4_ = local_5840;
                    auVar4._8_4_ = fStack_5838;
                    auVar4._12_4_ = fStack_5834;
                    auVar4._16_4_ = fStack_5830;
                    auVar4._20_4_ = fStack_582c;
                    auVar4._24_4_ = fStack_5828;
                    auVar4._28_4_ = uStack_5824;
                    auVar10 = vfmadd213ps_fma(auVar22,local_58a0,auVar4);
                    uVar2 = *(undefined4 *)(uVar17 + 0xc0 + uVar13 * 4);
                    auVar28._4_4_ = uVar2;
                    auVar28._0_4_ = uVar2;
                    auVar28._8_4_ = uVar2;
                    auVar28._12_4_ = uVar2;
                    auVar28._16_4_ = uVar2;
                    auVar28._20_4_ = uVar2;
                    auVar28._24_4_ = uVar2;
                    auVar28._28_4_ = uVar2;
                    auVar5._4_4_ = fStack_585c;
                    auVar5._0_4_ = local_5860;
                    auVar5._8_4_ = fStack_5858;
                    auVar5._12_4_ = fStack_5854;
                    auVar5._16_4_ = fStack_5850;
                    auVar5._20_4_ = fStack_584c;
                    auVar5._24_4_ = fStack_5848;
                    auVar5._28_4_ = uStack_5844;
                    auVar9 = vfmadd213ps_fma(auVar28,local_5880,auVar5);
                    uVar2 = *(undefined4 *)(uVar17 + 0x60 + uVar13 * 4);
                    auVar29._4_4_ = uVar2;
                    auVar29._0_4_ = uVar2;
                    auVar29._8_4_ = uVar2;
                    auVar29._12_4_ = uVar2;
                    auVar29._16_4_ = uVar2;
                    auVar29._20_4_ = uVar2;
                    auVar29._24_4_ = uVar2;
                    auVar29._28_4_ = uVar2;
                    auVar6 = vfmadd213ps_fma(auVar29,local_58c0,local_5920);
                    uVar2 = *(undefined4 *)(uVar17 + 0xa0 + uVar13 * 4);
                    auVar30._4_4_ = uVar2;
                    auVar30._0_4_ = uVar2;
                    auVar30._8_4_ = uVar2;
                    auVar30._12_4_ = uVar2;
                    auVar30._16_4_ = uVar2;
                    auVar30._20_4_ = uVar2;
                    auVar30._24_4_ = uVar2;
                    auVar30._28_4_ = uVar2;
                    uVar2 = *(undefined4 *)(uVar17 + 0xe0 + uVar13 * 4);
                    auVar31._4_4_ = uVar2;
                    auVar31._0_4_ = uVar2;
                    auVar31._8_4_ = uVar2;
                    auVar31._12_4_ = uVar2;
                    auVar31._16_4_ = uVar2;
                    auVar31._20_4_ = uVar2;
                    auVar31._24_4_ = uVar2;
                    auVar31._28_4_ = uVar2;
                    auVar7 = vfmadd213ps_fma(auVar30,local_58a0,auVar4);
                    auVar8 = vfmadd213ps_fma(auVar31,local_5880,auVar5);
                    auVar5 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar6));
                    auVar4 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar7));
                    auVar5 = vpmaxsd_avx2(auVar5,auVar4);
                    auVar4 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar8));
                    auVar4 = vpmaxsd_avx2(auVar5,auVar4);
                    auVar5 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar6));
                    auVar24 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar7));
                    auVar25 = vpminsd_avx2(auVar5,auVar24);
                    auVar5 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar8));
                    auVar24 = vpmaxsd_avx2(auVar4,local_58e0);
                    auVar5 = vpminsd_avx2(auVar5,local_5900);
                    auVar5 = vpminsd_avx2(auVar25,auVar5);
                    auVar5 = vcmpps_avx(auVar24,auVar5,2);
                    if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar5 >> 0x7f,0) != '\0') ||
                          (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar5 >> 0xbf,0) != '\0') ||
                        (auVar5 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar5[0x1f] < '\0') {
                      auVar5 = vblendvps_avx(auVar36._0_32_,auVar4,auVar5);
                      auVar22 = auVar23._0_32_;
                      auVar4 = vcmpps_avx(auVar5,auVar22,1);
                      uVar14 = uVar3;
                      auVar24 = auVar22;
                      auVar25 = auVar5;
                      if (((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                && (auVar4 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar4 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) && SUB321(auVar4 >> 0x7f,0) == '\0') &&
                             (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            SUB321(auVar4 >> 0xbf,0) == '\0') &&
                           (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           -1 < auVar4[0x1f]) ||
                         (bVar21 = uVar18 != 8, uVar14 = uVar18, uVar18 = uVar3, auVar24 = auVar5,
                         auVar25 = auVar22, bVar21)) {
                        uVar15 = uVar15 + 1;
                        *puVar20 = uVar14;
                        puVar20 = puVar20 + 1;
                        *pauVar16 = auVar25;
                        pauVar16 = pauVar16 + 1;
                        auVar23 = ZEXT3264(auVar24);
                      }
                      else {
                        auVar23 = ZEXT3264(auVar5);
                      }
                    }
                  }
                } while ((uVar3 != 8) && (bVar21 = uVar13 < 7, uVar13 = uVar13 + 1, bVar21));
                if (1 < uVar15 && uVar18 != 8) {
                  auVar5 = pauVar16[-2];
                  auVar4 = vcmpps_avx(auVar5,pauVar16[-1],1);
                  if ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar4 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar4 >> 0x7f,0) != '\0') ||
                        (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar4 >> 0xbf,0) != '\0') ||
                      (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar4[0x1f] < '\0') {
                    pauVar16[-2] = pauVar16[-1];
                    pauVar16[-1] = auVar5;
                    auVar11 = vpermilps_avx(*(undefined1 (*) [16])(puVar20 + -2),0x4e);
                    *(undefined1 (*) [16])(puVar20 + -2) = auVar11;
                  }
                  if (uVar15 != 2) {
                    auVar5 = pauVar16[-3];
                    auVar4 = vcmpps_avx(auVar5,pauVar16[-1],1);
                    if ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar4 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar4 >> 0x7f,0) != '\0') ||
                          (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar4 >> 0xbf,0) != '\0') ||
                        (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar4[0x1f] < '\0') {
                      pauVar16[-3] = pauVar16[-1];
                      pauVar16[-1] = auVar5;
                      uVar17 = puVar20[-3];
                      puVar20[-3] = puVar20[-1];
                      puVar20[-1] = uVar17;
                    }
                    auVar5 = pauVar16[-3];
                    auVar4 = vcmpps_avx(auVar5,pauVar16[-2],1);
                    if ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar4 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar4 >> 0x7f,0) != '\0') ||
                          (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar4 >> 0xbf,0) != '\0') ||
                        (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar4[0x1f] < '\0') {
                      pauVar16[-3] = pauVar16[-2];
                      pauVar16[-2] = auVar5;
                      auVar11 = vpermilps_avx(*(undefined1 (*) [16])(puVar20 + -3),0x4e);
                      *(undefined1 (*) [16])(puVar20 + -3) = auVar11;
                    }
                  }
                }
                uVar17 = uVar18;
              } while (uVar18 != 8);
            }
            bVar12 = false;
          }
LAB_006a01af:
        } while (!bVar12);
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }